

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

vector<uint256,_std::allocator<uint256>_> *
LocatorEntries(vector<uint256,_std::allocator<uint256>_> *__return_storage_ptr__,CBlockIndex *index)

{
  uint256 *puVar1;
  iterator __position;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int height;
  long in_FS_OFFSET;
  uint256 local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (index != (CBlockIndex *)0x0) {
    std::vector<uint256,_std::allocator<uint256>_>::reserve(__return_storage_ptr__,0x20);
    iVar5 = 1;
    do {
      puVar1 = index->phashBlock;
      if (puVar1 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                  (__return_storage_ptr__,__position,&local_58);
      }
      else {
        uVar2 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
        uVar3 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
        uVar4 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             uVar4;
        *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems = uVar2;
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8) =
             uVar3;
        (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (index->nHeight == 0) break;
      height = index->nHeight - iVar5;
      if (height < 1) {
        height = 0;
      }
      index = CBlockIndex::GetAncestor(index,height);
      iVar5 = iVar5 << (0x140U < (ulong)((long)(__return_storage_ptr__->
                                               super__Vector_base<uint256,_std::allocator<uint256>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(__return_storage_ptr__->
                                              super__Vector_base<uint256,_std::allocator<uint256>_>)
                                              ._M_impl.super__Vector_impl_data._M_start));
    } while (index != (CBlockIndex *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<uint256> LocatorEntries(const CBlockIndex* index)
{
    int step = 1;
    std::vector<uint256> have;
    if (index == nullptr) return have;

    have.reserve(32);
    while (index) {
        have.emplace_back(index->GetBlockHash());
        if (index->nHeight == 0) break;
        // Exponentially larger steps back, plus the genesis block.
        int height = std::max(index->nHeight - step, 0);
        // Use skiplist.
        index = index->GetAncestor(height);
        if (have.size() > 10) step *= 2;
    }
    return have;
}